

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O0

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty
               (BenchmarkContext *context)

{
  anon_class_8_1_54a39813 local_c0;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88 [32];
  anon_class_8_1_54a39813 local_68 [3];
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  s;
  int64_t n;
  BenchmarkContext *context_local;
  
  s._size = BenchmarkContext::GetIterationsCount(context);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::StorageArray((StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
                  *)local_28,s._size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"create",&local_49);
  local_68[0].s =
       (StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
        *)local_28;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_48,s._size,local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"signal",&local_89);
  (*context->_vptr_BenchmarkContext[2])(context,local_88,s._size);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"destroy",&local_b1);
  local_c0.s = (StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
                *)local_28;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_b0,s._size,&local_c0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::~StorageArray((StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
                   *)local_28);
  return;
}

Assistant:

static void CreateEmpty(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<SignalType> s(n);

            context.Profile("create", n, [&]{ s.Construct(); });
            context.MeasureMemory("signal", n);
            context.Profile("destroy", n, [&]{ s.Destruct(); });
        }